

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

Statement * __thiscall SQLite::Statement::getExpandedSQL_abi_cxx11_(Statement *this)

{
  sqlite3_stmt *pStmt;
  char *pcVar1;
  Statement *in_RSI;
  allocator local_22;
  undefined1 local_21;
  char *local_20;
  char *expanded;
  Statement *this_local;
  string *expandedString;
  
  this_local = this;
  pStmt = getPreparedStatement(in_RSI);
  pcVar1 = sqlite3_expanded_sql(pStmt);
  local_21 = 0;
  local_20 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  sqlite3_free(local_20);
  return this;
}

Assistant:

std::string Statement::getExpandedSQL() const {
    char* expanded = sqlite3_expanded_sql(getPreparedStatement());
    std::string expandedString(expanded);
    sqlite3_free(expanded);
    return expandedString;
}